

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

CTcPrsNode * __thiscall CTPNSymBase::adjust_for_dyn(CTPNSymBase *this,tcpn_dyncomp_info *param_1)

{
  CTcSymbol *pCVar1;
  
  pCVar1 = CTcPrsSymtab::find(G_prs->global_symtab_,this->sym_,this->len_);
  if (pCVar1 != (CTcSymbol *)0x0) {
    return &this->super_CTcPrsNode;
  }
  CTcTokenizer::log_error(0x2b18,(ulong)(uint)this->len_,this->sym_);
  err_throw_a(0x2b18,2,0,(ulong)(uint)this->len_,2,this->sym_);
}

Assistant:

CTcPrsNode *CTPNSymBase::adjust_for_dyn(const tcpn_dyncomp_info *)
{
    /* 
     *   If this symbol isn't defined in the global symbol table, we can't
     *   evaluate this expression in the debugger - new symbols can never
     *   be defined in the debugger, so there's no point in trying to hold
     *   a forward reference as we normally would for an undefined symbol.
     *   We need look only in the global symbol table because local
     *   symbols will already have been resolved.  
     */
    if (G_prs->get_global_symtab()->find(sym_, len_) == 0)
    {
        /* log the error, to generate an appropriate message */
        G_tok->log_error(TCERR_UNDEF_SYM, (int)len_, sym_);
        
        /* throw the error as well */
        err_throw_a(TCERR_UNDEF_SYM, 2,
                    ERR_TYPE_INT, (int)len_, ERR_TYPE_TEXTCHAR, sym_);
    }
    
    /* return myself unchanged */
    return this;
}